

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

char * ImGui::TableGetColumnName(int column_n)

{
  ImGuiTable *table;
  char *pcVar1;
  ImGuiTableColumn *pIVar2;
  
  table = GImGui->CurrentTable;
  if (table == (ImGuiTable *)0x0) {
    return (char *)0x0;
  }
  if (column_n < 0) {
    pcVar1 = TableGetColumnName(table,table->CurrentColumn);
    return pcVar1;
  }
  if ((table->IsLayoutLocked != false) || (column_n < table->DeclColumnsCount)) {
    pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_n);
    if (pIVar2->NameOffset != -1) {
      pcVar1 = ImVector<char>::operator[](&(table->ColumnsNames).Buf,(int)pIVar2->NameOffset);
      return pcVar1;
    }
  }
  return "";
}

Assistant:

const char* ImGui::TableGetColumnName(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return NULL;
    if (column_n < 0)
        column_n = table->CurrentColumn;
    return TableGetColumnName(table, column_n);
}